

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O0

void __thiscall QFileSystemComboBox::setCurrentFilePath(QFileSystemComboBox *this,QString *filePath)

{
  byte bVar1;
  bool bVar2;
  QString *in_RSI;
  QFileSystemComboBoxPrivate *in_RDI;
  QFileInfo fileInfo;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QFileInfo *in_stack_ffffffffffffff10;
  QFileInfo *value2;
  undefined7 in_stack_ffffffffffffff18;
  int iVar3;
  QFlags<Qt::MatchFlag> local_d4 [8];
  undefined4 local_b4;
  QString *in_stack_ffffffffffffff50;
  QFileSystemComboBox *in_stack_ffffffffffffff58;
  MatchFlags in_stack_ffffffffffffff64;
  QFileInfo local_18 [24];
  
  QFileInfo::QFileInfo(local_18,in_RSI);
  rootPath((QFileSystemComboBox *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QFileInfo::absolutePath();
  bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff10,
                       (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QString::~QString((QString *)0x2221ca);
  QString::~QString((QString *)0x2221d7);
  if ((bVar1 & 1) == 0) {
    if (((*(byte *)(*(long *)&(in_RDI->layoutValue).
                              super__Optional_base<std::pair<int,_QFileInfo>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::pair<int,_QFileInfo>,_true,_false,_false>
                              .super__Optional_payload_base<std::pair<int,_QFileInfo>_>._M_payload +
                   0x20) & 1) != 0) ||
       (bVar2 = std::optional::operator_cast_to_bool
                          ((optional<std::pair<int,_QFileInfo>_> *)0x222340), bVar2)) {
      local_b4 = 0xffffffff;
      qMakePair<int,QFileInfo_const&>
                ((int *)CONCAT17(bVar1,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10);
      std::optional<std::pair<int,QFileInfo>>::operator=
                ((optional<std::pair<int,_QFileInfo>_> *)in_RDI,
                 (pair<int,_QFileInfo> *)CONCAT17(bVar1,in_stack_ffffffffffffff18));
      std::pair<int,_QFileInfo>::~pair((pair<int,_QFileInfo> *)0x22238a);
    }
    else {
      QFileInfo::fileName();
      iVar3 = (int)in_RDI;
      QFlags<Qt::MatchFlag>::QFlags(local_d4,MatchCaseSensitive);
      findFileName(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff64);
      QComboBox::setCurrentIndex(iVar3);
      QString::~QString((QString *)0x222408);
    }
  }
  else {
    value2 = *(QFileInfo **)
              &(in_RDI->layoutValue).super__Optional_base<std::pair<int,_QFileInfo>,_false,_false>.
               _M_payload.super__Optional_payload<std::pair<int,_QFileInfo>,_true,_false,_false>.
               super__Optional_payload_base<std::pair<int,_QFileInfo>_>._M_payload;
    QFileInfo::absolutePath();
    qMakePair<int,QFileInfo_const&>((int *)CONCAT17(bVar1,in_stack_ffffffffffffff18),value2);
    std::optional<std::pair<int,_QFileInfo>_>::optional<std::pair<int,_QFileInfo>,_true>
              ((optional<std::pair<int,_QFileInfo>_> *)value2,
               (pair<int,_QFileInfo> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
              );
    QFileSystemComboBoxPrivate::setRootPath
              (in_RDI,(QString *)CONCAT17(bVar1,in_stack_ffffffffffffff18),(LayoutValue *)value2);
    std::optional<std::pair<int,_QFileInfo>_>::~optional
              ((optional<std::pair<int,_QFileInfo>_> *)0x22225e);
    std::pair<int,_QFileInfo>::~pair((pair<int,_QFileInfo> *)0x222268);
    QString::~QString((QString *)0x222275);
  }
  QFileInfo::~QFileInfo(local_18);
  return;
}

Assistant:

void QFileSystemComboBox::setCurrentFilePath(const QString &filePath) {
    const QFileInfo fileInfo(filePath);

    if (rootPath() != fileInfo.absolutePath()) {
        d->setRootPath(fileInfo.absolutePath(), qMakePair(-1, fileInfo));
    } else {
        if (d->initialSorting || d->layoutValue) {
            d->layoutValue = qMakePair(-1, fileInfo);
        } else {
            setCurrentIndex(findFileName(fileInfo.fileName()));
        }
    }
}